

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTrace.cpp
# Opt level: O1

void __thiscall
llbuild::core::BuildEngineTrace::finishedTask
          (BuildEngineTrace *this,Task *task,Rule *rule,bool wasChanged)

{
  FILE *__stream;
  ulong uVar1;
  _Hash_node_base *p_Var2;
  char *pcVar3;
  char *pcVar4;
  undefined7 in_register_00000009;
  ulong uVar5;
  _Node_iterator_base<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  __it;
  char *pcVar6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  
  __stream = (FILE *)this->outputPtr;
  pcVar3 = getTaskName(this,task);
  pcVar4 = getRuleName(this,rule);
  pcVar6 = "unchanged";
  if ((int)CONCAT71(in_register_00000009,wasChanged) != 0) {
    pcVar6 = "changed";
  }
  fprintf(__stream,"{ \"finished-task\", \"%s\", \"%s\", \"%s\" },\n",pcVar3,pcVar4,pcVar6);
  uVar1 = (this->taskNames)._M_h._M_bucket_count;
  uVar5 = (ulong)task % uVar1;
  p_Var7 = (this->taskNames)._M_h._M_buckets[uVar5];
  p_Var8 = (__node_base_ptr)0x0;
  if ((p_Var7 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var7->_M_nxt, p_Var8 = p_Var7, p_Var7->_M_nxt[1]._M_nxt != (_Hash_node_base *)task)
     ) {
    while (p_Var7 = p_Var2, p_Var2 = p_Var7->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var8 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar5) ||
         (p_Var8 = p_Var7, p_Var2[1]._M_nxt == (_Hash_node_base *)task)) goto LAB_00167573;
    }
    p_Var8 = (__node_base_ptr)0x0;
  }
LAB_00167573:
  if (p_Var8 == (__node_base_ptr)0x0) {
    __it._M_cur = (__node_type *)0x0;
  }
  else {
    __it._M_cur = (__node_type *)p_Var8->_M_nxt;
  }
  std::
  _Hashtable<const_llbuild::core::Task_*,_std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llbuild::core::Task_*>,_std::hash<const_llbuild::core::Task_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::erase(&(this->taskNames)._M_h,(const_iterator)__it._M_cur);
  return;
}

Assistant:

void BuildEngineTrace::finishedTask(const Task* task, const Rule* rule,
                                    bool wasChanged) {
  FILE *fp = static_cast<FILE*>(outputPtr);

  fprintf(fp, "{ \"finished-task\", \"%s\", \"%s\", \"%s\" },\n",
          getTaskName(task), getRuleName(rule),
          wasChanged ? "changed" : "unchanged");

  // Delete the task entry, as it could be reused.
  taskNames.erase(taskNames.find(task));
}